

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.c
# Opt level: O2

int sx_ini_property_count(sx_ini *ini,int section)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (ini == (sx_ini *)0x0) {
    iVar1 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = (ulong)(uint)ini->property_count;
    if (ini->property_count < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 * 0x78 - uVar3 != 0; uVar3 = uVar3 + 0x78) {
      iVar1 = iVar1 + (uint)(*(int *)(ini->properties->name + (uVar3 - 4)) == section);
    }
  }
  return iVar1;
}

Assistant:

int sx_ini_property_count(sx_ini const* ini, int section)
{
    return ini_property_count(ini, section);
}